

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode.c
# Opt level: O0

int CVode(void *cvode_mem,realtype tout,N_Vector yout,realtype *tret,int itask)

{
  int iVar1;
  uint uVar2;
  int in_ECX;
  realtype *in_RDX;
  N_Vector in_RSI;
  CVodeMem in_RDI;
  CVodeMem in_XMM0_Qa;
  double dVar3;
  int inactive_roots;
  realtype nrm;
  realtype rh;
  realtype tout_hin;
  realtype troundoff;
  int ewtsetOK;
  int irfndp;
  int ier;
  int ir;
  int istate;
  int kflag;
  int hflag;
  int retval;
  long nstloc;
  CVodeMem cv_mem;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  N_Vector in_stack_ffffffffffffff80;
  CVodeMem in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  realtype in_stack_ffffffffffffffc0;
  realtype rVar4;
  int local_4;
  
  if (in_RDI == (CVodeMem)0x0) {
    cvProcessError((CVodeMem)0x0,-0x15,"CVODE","CVode","cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (in_RDI->cv_MallocDone == 0) {
    cvProcessError(in_RDI,-0x17,"CVODE","CVode","Attempt to call before CVodeInit.");
    local_4 = -0x17;
  }
  else {
    in_RDI->cv_y = in_RSI;
    if (in_RSI == (N_Vector)0x0) {
      cvProcessError(in_RDI,-0x16,"CVODE","CVode","yout = NULL illegal.");
      local_4 = -0x16;
    }
    else if (in_RDX == (realtype *)0x0) {
      cvProcessError(in_RDI,-0x16,"CVODE","CVode","tret = NULL illegal.");
      local_4 = -0x16;
    }
    else if ((in_ECX == 1) || (in_ECX == 2)) {
      if (in_ECX == 1) {
        in_RDI->cv_toutc = (realtype)in_XMM0_Qa;
      }
      in_RDI->cv_taskc = in_ECX;
      if (in_RDI->cv_nst == 0) {
        rVar4 = in_RDI->cv_tn;
        *in_RDX = rVar4;
        in_RDI->cv_tretlast = rVar4;
        in_stack_ffffffffffffffa8 =
             cvInitialSetup((CVodeMem)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78))
        ;
        if (in_stack_ffffffffffffffa8 != 0) {
          return in_stack_ffffffffffffffa8;
        }
        in_stack_ffffffffffffffbc =
             (*in_RDI->cv_f)(in_RDI->cv_tn,in_RDI->cv_zn[0],in_RDI->cv_zn[1],in_RDI->cv_user_data);
        in_RDI->cv_nfe = in_RDI->cv_nfe + 1;
        if (in_stack_ffffffffffffffbc < 0) {
          cvProcessError((CVodeMem)in_RDI->cv_tn,(int)in_RDI,(char *)0xfffffff8,"CVODE","CVode",
                         "At t = %lg, the right-hand side routine failed in an unrecoverable manner."
                        );
          return -8;
        }
        if (0 < in_stack_ffffffffffffffbc) {
          cvProcessError(in_RDI,-9,"CVODE","CVode",
                         "The right-hand side routine failed at the first call.");
          return -9;
        }
        if ((in_RDI->cv_tstopset != 0) &&
           ((in_RDI->cv_tstop - in_RDI->cv_tn) * ((double)in_XMM0_Qa - in_RDI->cv_tn) <= 0.0)) {
          cvProcessError((CVodeMem)in_RDI->cv_tstop,(int)in_RDI->cv_tn,(char *)in_RDI,
                         (char *)0xffffffea,"CVODE","CVode",
                         "The value tstop = %lg is behind current t = %lg in the direction of integration."
                        );
          return -0x16;
        }
        in_RDI->cv_h = in_RDI->cv_hin;
        if (((in_RDI->cv_h != 0.0) || (NAN(in_RDI->cv_h))) &&
           (((double)in_XMM0_Qa - in_RDI->cv_tn) * in_RDI->cv_h < 0.0)) {
          cvProcessError(in_RDI,-0x16,"CVODE","CVode","h0 and tout - t0 inconsistent.");
          return -0x16;
        }
        if ((in_RDI->cv_h == 0.0) && (!NAN(in_RDI->cv_h))) {
          iVar1 = cvHin(_ewtsetOK,troundoff);
          if (iVar1 != 0) {
            iVar1 = cvHandleFailure((CVodeMem)
                                    CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0)
            ;
            return iVar1;
          }
          in_stack_ffffffffffffffb8 = 0;
        }
        in_stack_ffffffffffffff88 = (CVodeMem)(ABS(in_RDI->cv_h) * in_RDI->cv_hmax_inv);
        if (1.0 < (double)in_stack_ffffffffffffff88) {
          in_RDI->cv_h = in_RDI->cv_h / (double)in_stack_ffffffffffffff88;
        }
        if (ABS(in_RDI->cv_h) < in_RDI->cv_hmin) {
          in_RDI->cv_h = (in_RDI->cv_hmin / ABS(in_RDI->cv_h)) * in_RDI->cv_h;
        }
        if ((in_RDI->cv_tstopset != 0) &&
           (0.0 < ((in_RDI->cv_tn + in_RDI->cv_h) - in_RDI->cv_tstop) * in_RDI->cv_h)) {
          in_RDI->cv_h = (in_RDI->cv_tstop - in_RDI->cv_tn) * (in_RDI->cv_uround * -4.0 + 1.0);
        }
        in_RDI->cv_hscale = in_RDI->cv_h;
        in_RDI->cv_h0u = in_RDI->cv_h;
        in_RDI->cv_hprime = in_RDI->cv_h;
        N_VScale((realtype)in_stack_ffffffffffffff80,
                 (N_Vector)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                 (N_Vector)0xeee07a);
        if ((0 < in_RDI->cv_nrtfn) &&
           (in_stack_ffffffffffffffbc =
                 cvRcheck1((CVodeMem)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)),
           in_stack_ffffffffffffffbc == -0xc)) {
          cvProcessError((CVodeMem)in_RDI->cv_tn,(int)in_RDI,(char *)0xfffffff4,"CVODE","cvRcheck1",
                         "At t = %lg, the rootfinding routine failed in an unrecoverable manner.");
          return -0xc;
        }
      }
      if (0 < in_RDI->cv_nst) {
        dVar3 = in_RDI->cv_uround * 100.0 * (ABS(in_RDI->cv_tn) + ABS(in_RDI->cv_h));
        if (0 < in_RDI->cv_nrtfn) {
          iVar1 = in_RDI->cv_irfnd;
          in_stack_ffffffffffffffbc =
               cvRcheck2((CVodeMem)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
          if (in_stack_ffffffffffffffbc == 3) {
            cvProcessError((CVodeMem)in_RDI->cv_tlo,(int)in_RDI,(char *)0xffffffea,"CVODE",
                           "cvRcheck2","Root found at and very near t = %lg.");
            return -0x16;
          }
          if (in_stack_ffffffffffffffbc == -0xc) {
            cvProcessError((CVodeMem)in_RDI->cv_tlo,(int)in_RDI,(char *)0xfffffff4,"CVODE",
                           "cvRcheck2",
                           "At t = %lg, the rootfinding routine failed in an unrecoverable manner.")
            ;
            return -0xc;
          }
          if (in_stack_ffffffffffffffbc == 1) {
            rVar4 = in_RDI->cv_tlo;
            *in_RDX = rVar4;
            in_RDI->cv_tretlast = rVar4;
            return 2;
          }
          if (dVar3 < ABS(in_RDI->cv_tn - in_RDI->cv_tretlast)) {
            in_stack_ffffffffffffffbc = cvRcheck3(in_stack_ffffffffffffff88);
            if (in_stack_ffffffffffffffbc == 0) {
              in_RDI->cv_irfnd = 0;
              if ((iVar1 == 1) && (in_ECX == 2)) {
                rVar4 = in_RDI->cv_tn;
                *in_RDX = rVar4;
                in_RDI->cv_tretlast = rVar4;
                N_VScale((realtype)in_stack_ffffffffffffff80,
                         (N_Vector)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                         (N_Vector)0xeee2e9);
                return 0;
              }
            }
            else {
              if (in_stack_ffffffffffffffbc == 1) {
                in_RDI->cv_irfnd = 1;
                rVar4 = in_RDI->cv_tlo;
                *in_RDX = rVar4;
                in_RDI->cv_tretlast = rVar4;
                return 2;
              }
              if (in_stack_ffffffffffffffbc == -0xc) {
                cvProcessError((CVodeMem)in_RDI->cv_tlo,(int)in_RDI,(char *)0xfffffff4,"CVODE",
                               "cvRcheck3",
                               "At t = %lg, the rootfinding routine failed in an unrecoverable manner."
                              );
                return -0xc;
              }
            }
          }
        }
        if ((in_ECX == 1) && (0.0 <= (in_RDI->cv_tn - (double)in_XMM0_Qa) * in_RDI->cv_h)) {
          *in_RDX = (realtype)in_XMM0_Qa;
          in_RDI->cv_tretlast = (realtype)in_XMM0_Qa;
          iVar1 = CVodeGetDky(in_RDI,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                              (N_Vector)
                              CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
          if (iVar1 != 0) {
            cvProcessError(in_XMM0_Qa,(int)in_RDI,(char *)0xffffffea,"CVODE","CVode",
                           "Trouble interpolating at tout = %lg. tout too far back in direction of integration"
                          );
            return -0x16;
          }
          return 0;
        }
        if ((in_ECX == 2) && (dVar3 < ABS(in_RDI->cv_tn - in_RDI->cv_tretlast))) {
          rVar4 = in_RDI->cv_tn;
          *in_RDX = rVar4;
          in_RDI->cv_tretlast = rVar4;
          N_VScale((realtype)in_stack_ffffffffffffff80,
                   (N_Vector)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                   (N_Vector)0xeee4cd);
          return 0;
        }
        if (in_RDI->cv_tstopset != 0) {
          if (ABS(in_RDI->cv_tn - in_RDI->cv_tstop) <= dVar3) {
            iVar1 = CVodeGetDky(in_RDI,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                                (N_Vector)
                                CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
            if (iVar1 != 0) {
              cvProcessError((CVodeMem)in_RDI->cv_tstop,(int)in_RDI->cv_tn,(char *)in_RDI,
                             (char *)0xffffffea,"CVODE","CVode",
                             "The value tstop = %lg is behind current t = %lg in the direction of integration."
                            );
              return -0x16;
            }
            rVar4 = in_RDI->cv_tstop;
            *in_RDX = rVar4;
            in_RDI->cv_tretlast = rVar4;
            in_RDI->cv_tstopset = 0;
            return 1;
          }
          if (0.0 < ((in_RDI->cv_tn + in_RDI->cv_hprime) - in_RDI->cv_tstop) * in_RDI->cv_h) {
            in_RDI->cv_hprime =
                 (in_RDI->cv_tstop - in_RDI->cv_tn) * (in_RDI->cv_uround * -4.0 + 1.0);
            in_RDI->cv_eta = in_RDI->cv_hprime / in_RDI->cv_h;
          }
        }
      }
      rVar4 = 0.0;
      do {
        in_RDI->cv_next_h = in_RDI->cv_h;
        in_RDI->cv_next_q = in_RDI->cv_q;
        if ((0 < in_RDI->cv_nst) &&
           (iVar1 = (*in_RDI->cv_efun)(in_RDI->cv_zn[0],in_RDI->cv_ewt,in_RDI->cv_e_data),
           iVar1 != 0)) {
          if (in_RDI->cv_itol == 3) {
            cvProcessError((CVodeMem)in_RDI->cv_tn,(int)in_RDI,(char *)0xffffffea,"CVODE","CVode",
                           "At t = %lg, the user-provide EwtSet function failed.");
          }
          else {
            cvProcessError((CVodeMem)in_RDI->cv_tn,(int)in_RDI,(char *)0xffffffea,"CVODE","CVode",
                           "At t = %lg, a component of ewt has become <= 0.");
          }
          iVar1 = -0x16;
          rVar4 = in_RDI->cv_tn;
          *in_RDX = rVar4;
          in_RDI->cv_tretlast = rVar4;
          N_VScale((realtype)in_stack_ffffffffffffff80,
                   (N_Vector)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                   (N_Vector)0xeee7d1);
          return iVar1;
        }
        if ((0 < in_RDI->cv_mxstep) && (in_RDI->cv_mxstep <= (long)rVar4)) {
          cvProcessError((CVodeMem)in_RDI->cv_tn,(int)in_RDI,(char *)0xffffffff,"CVODE","CVode",
                         "At t = %lg, mxstep steps taken before reaching tout.");
          iVar1 = -1;
          rVar4 = in_RDI->cv_tn;
          *in_RDX = rVar4;
          in_RDI->cv_tretlast = rVar4;
          N_VScale((realtype)in_stack_ffffffffffffff80,
                   (N_Vector)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                   (N_Vector)0xeee877);
          return iVar1;
        }
        in_stack_ffffffffffffff80 =
             (N_Vector)
             N_VWrmsNorm(in_stack_ffffffffffffff80,
                         (N_Vector)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
        in_RDI->cv_tolsf = in_RDI->cv_uround * (double)in_stack_ffffffffffffff80;
        if (1.0 < in_RDI->cv_tolsf) {
          cvProcessError((CVodeMem)in_RDI->cv_tn,(int)in_RDI,(char *)0xfffffffe,"CVODE","CVode",
                         "At t = %lg, too much accuracy requested.");
          iVar1 = -2;
          rVar4 = in_RDI->cv_tn;
          *in_RDX = rVar4;
          in_RDI->cv_tretlast = rVar4;
          N_VScale((realtype)in_stack_ffffffffffffff80,
                   (N_Vector)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                   (N_Vector)0xeee951);
          in_RDI->cv_tolsf = in_RDI->cv_tolsf * 2.0;
          return iVar1;
        }
        in_RDI->cv_tolsf = 1.0;
        dVar3 = in_RDI->cv_tn + in_RDI->cv_h;
        if ((dVar3 == in_RDI->cv_tn) && (!NAN(dVar3) && !NAN(in_RDI->cv_tn))) {
          in_RDI->cv_nhnil = in_RDI->cv_nhnil + 1;
          if (in_RDI->cv_nhnil <= in_RDI->cv_mxhnil) {
            cvProcessError((CVodeMem)in_RDI->cv_tn,(int)in_RDI,(char *)0x63,"CVODE","CVode",
                           "Internal t = %lg and h = %lg are such that t + h = t on the next step. The solver will continue anyway."
                          );
          }
          if (in_RDI->cv_nhnil == in_RDI->cv_mxhnil) {
            cvProcessError(in_RDI,99,"CVODE","CVode",
                           "The above warning has been issued mxhnil times and will not be issued again for this problem."
                          );
          }
        }
        uVar2 = cvStep((CVodeMem)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
        if (uVar2 != 0) {
          iVar1 = cvHandleFailure((CVodeMem)
                                  CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0);
          rVar4 = in_RDI->cv_tn;
          *in_RDX = rVar4;
          in_RDI->cv_tretlast = rVar4;
          N_VScale((realtype)in_stack_ffffffffffffff80,
                   (N_Vector)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                   (N_Vector)0xeeeacc);
          return iVar1;
        }
        rVar4 = (realtype)((long)rVar4 + 1);
        if ((in_RDI->cv_tstopset != 0) &&
           (ABS(in_RDI->cv_tn - in_RDI->cv_tstop) <=
            in_RDI->cv_uround * 100.0 * (ABS(in_RDI->cv_tn) + ABS(in_RDI->cv_h)))) {
          in_RDI->cv_tn = in_RDI->cv_tstop;
        }
        if (0 < in_RDI->cv_nrtfn) {
          in_stack_ffffffffffffffbc = cvRcheck3(in_stack_ffffffffffffff88);
          if (in_stack_ffffffffffffffbc == 1) {
            in_RDI->cv_irfnd = 1;
            rVar4 = in_RDI->cv_tlo;
            *in_RDX = rVar4;
            in_RDI->cv_tretlast = rVar4;
            return 2;
          }
          if (in_stack_ffffffffffffffbc == -0xc) {
            cvProcessError((CVodeMem)in_RDI->cv_tlo,(int)in_RDI,(char *)0xfffffff4,"CVODE",
                           "cvRcheck3",
                           "At t = %lg, the rootfinding routine failed in an unrecoverable manner.")
            ;
            return -0xc;
          }
          if (in_RDI->cv_nst == 1) {
            in_stack_ffffffffffffff7c = 0;
            for (iVar1 = 0; iVar1 < in_RDI->cv_nrtfn; iVar1 = iVar1 + 1) {
              if (in_RDI->cv_gactive[iVar1] == 0) {
                in_stack_ffffffffffffff7c = 1;
                break;
              }
            }
            if ((0 < in_RDI->cv_mxgnull) && (in_stack_ffffffffffffff7c != 0)) {
              cvProcessError(in_RDI,99,"CVODE","CVode",
                             "At the end of the first step, there are still some root functions identically 0. This warning will not be issued again."
                            );
            }
          }
        }
        if ((in_ECX == 1) && (0.0 <= (in_RDI->cv_tn - (double)in_XMM0_Qa) * in_RDI->cv_h)) {
          iVar1 = 0;
          *in_RDX = (realtype)in_XMM0_Qa;
          in_RDI->cv_tretlast = (realtype)in_XMM0_Qa;
          CVodeGetDky(in_RDI,rVar4,in_stack_ffffffffffffffbc,(N_Vector)((ulong)uVar2 << 0x20));
          in_RDI->cv_next_q = in_RDI->cv_qprime;
          in_RDI->cv_next_h = in_RDI->cv_hprime;
          return iVar1;
        }
        if (in_RDI->cv_tstopset != 0) {
          if (ABS(in_RDI->cv_tn - in_RDI->cv_tstop) <=
              in_RDI->cv_uround * 100.0 * (ABS(in_RDI->cv_tn) + ABS(in_RDI->cv_h))) {
            CVodeGetDky(in_RDI,rVar4,in_stack_ffffffffffffffbc,
                        (N_Vector)CONCAT44(uVar2,in_stack_ffffffffffffffb0));
            rVar4 = in_RDI->cv_tstop;
            *in_RDX = rVar4;
            in_RDI->cv_tretlast = rVar4;
            in_RDI->cv_tstopset = 0;
            return 1;
          }
          if (0.0 < ((in_RDI->cv_tn + in_RDI->cv_hprime) - in_RDI->cv_tstop) * in_RDI->cv_h) {
            in_RDI->cv_hprime =
                 (in_RDI->cv_tstop - in_RDI->cv_tn) * (in_RDI->cv_uround * -4.0 + 1.0);
            in_RDI->cv_eta = in_RDI->cv_hprime / in_RDI->cv_h;
          }
        }
      } while (in_ECX != 2);
      local_4 = 0;
      rVar4 = in_RDI->cv_tn;
      *in_RDX = rVar4;
      in_RDI->cv_tretlast = rVar4;
      N_VScale((realtype)in_stack_ffffffffffffff80,
               (N_Vector)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
               (N_Vector)0xeeef74);
      in_RDI->cv_next_q = in_RDI->cv_qprime;
      in_RDI->cv_next_h = in_RDI->cv_hprime;
    }
    else {
      cvProcessError(in_RDI,-0x16,"CVODE","CVode","Illegal value for itask.");
      local_4 = -0x16;
    }
  }
  return local_4;
}

Assistant:

int CVode(void *cvode_mem, realtype tout, N_Vector yout,
          realtype *tret, int itask)
{
  CVodeMem cv_mem;
  long int nstloc;
  int retval, hflag, kflag, istate, ir, ier, irfndp;
  int ewtsetOK;
  realtype troundoff, tout_hin, rh, nrm;
  booleantype inactive_roots;

  /*
   * -------------------------------------
   * 1. Check and process inputs
   * -------------------------------------
   */

  /* Check if cvode_mem exists */
  if (cvode_mem == NULL) {
    cvProcessError(NULL, CV_MEM_NULL, "CVODE", "CVode", MSGCV_NO_MEM);
    return(CV_MEM_NULL);
  }
  cv_mem = (CVodeMem) cvode_mem;

  SUNDIALS_MARK_FUNCTION_BEGIN(CV_PROFILER);

  /* Check if cvode_mem was allocated */
  if (cv_mem->cv_MallocDone == SUNFALSE) {
    cvProcessError(cv_mem, CV_NO_MALLOC, "CVODE", "CVode", MSGCV_NO_MALLOC);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return(CV_NO_MALLOC);
  }

  /* Check for yout != NULL */
  if ((cv_mem->cv_y = yout) == NULL) {
    cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVode", MSGCV_YOUT_NULL);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return(CV_ILL_INPUT);
  }

  /* Check for tret != NULL */
  if (tret == NULL) {
    cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVode", MSGCV_TRET_NULL);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return(CV_ILL_INPUT);
  }

  /* Check for valid itask */
  if ( (itask != CV_NORMAL) && (itask != CV_ONE_STEP) ) {
    cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVode", MSGCV_BAD_ITASK);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return(CV_ILL_INPUT);
  }

  if (itask == CV_NORMAL) cv_mem->cv_toutc = tout;
  cv_mem->cv_taskc = itask;

  /*
   * ----------------------------------------
   * 2. Initializations performed only at
   *    the first step (nst=0):
   *    - initial setup
   *    - initialize Nordsieck history array
   *    - compute initial step size
   *    - check for approach to tstop
   *    - check for approach to a root
   * ----------------------------------------
   */

  if (cv_mem->cv_nst == 0) {

    cv_mem->cv_tretlast = *tret = cv_mem->cv_tn;

    /* Check inputs for corectness */

    ier = cvInitialSetup(cv_mem);
    if (ier != CV_SUCCESS) {
      SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
      return(ier);
    }

    /* Call f at (t0,y0), set zn[1] = y'(t0). */

    retval = cv_mem->cv_f(cv_mem->cv_tn, cv_mem->cv_zn[0],
                          cv_mem->cv_zn[1], cv_mem->cv_user_data);
    cv_mem->cv_nfe++;
    if (retval < 0) {
      cvProcessError(cv_mem, CV_RHSFUNC_FAIL, "CVODE", "CVode",
                     MSGCV_RHSFUNC_FAILED, cv_mem->cv_tn);
      SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
      return(CV_RHSFUNC_FAIL);
    }
    if (retval > 0) {
      cvProcessError(cv_mem, CV_FIRST_RHSFUNC_ERR, "CVODE", "CVode",
                     MSGCV_RHSFUNC_FIRST);
      SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
      return(CV_FIRST_RHSFUNC_ERR);
    }

    /* Test input tstop for legality. */

    if (cv_mem->cv_tstopset) {
      if ( (cv_mem->cv_tstop - cv_mem->cv_tn)*(tout - cv_mem->cv_tn) <= ZERO ) {
        cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVode",
                       MSGCV_BAD_TSTOP, cv_mem->cv_tstop, cv_mem->cv_tn);
        SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
        return(CV_ILL_INPUT);
      }
    }

    /* Set initial h (from H0 or cvHin). */

    cv_mem->cv_h = cv_mem->cv_hin;
    if ( (cv_mem->cv_h != ZERO) && ((tout-cv_mem->cv_tn)*cv_mem->cv_h < ZERO) ) {
      cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVode", MSGCV_BAD_H0);
      SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
      return(CV_ILL_INPUT);
    }
    if (cv_mem->cv_h == ZERO) {
      tout_hin = tout;
      if ( cv_mem->cv_tstopset &&
           (tout-cv_mem->cv_tn)*(tout-cv_mem->cv_tstop) > ZERO )
        tout_hin = cv_mem->cv_tstop;
      hflag = cvHin(cv_mem, tout_hin);
      if (hflag != CV_SUCCESS) {
        istate = cvHandleFailure(cv_mem, hflag);
        SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
        return(istate);
      }
    }

    /* Enforce hmax and hmin */

    rh = SUNRabs(cv_mem->cv_h)*cv_mem->cv_hmax_inv;
    if (rh > ONE) cv_mem->cv_h /= rh;
    if (SUNRabs(cv_mem->cv_h) < cv_mem->cv_hmin)
      cv_mem->cv_h *= cv_mem->cv_hmin/SUNRabs(cv_mem->cv_h);

    /* Check for approach to tstop */

    if (cv_mem->cv_tstopset) {
      if ( (cv_mem->cv_tn + cv_mem->cv_h - cv_mem->cv_tstop)*cv_mem->cv_h > ZERO )
        cv_mem->cv_h = (cv_mem->cv_tstop - cv_mem->cv_tn)*(ONE-FOUR*cv_mem->cv_uround);
    }

    /* Scale zn[1] by h.*/

    cv_mem->cv_hscale = cv_mem->cv_h;
    cv_mem->cv_h0u    = cv_mem->cv_h;
    cv_mem->cv_hprime = cv_mem->cv_h;

    N_VScale(cv_mem->cv_h, cv_mem->cv_zn[1], cv_mem->cv_zn[1]);

    /* Check for zeros of root function g at and near t0. */

    if (cv_mem->cv_nrtfn > 0) {

      retval = cvRcheck1(cv_mem);

      if (retval == CV_RTFUNC_FAIL) {
        cvProcessError(cv_mem, CV_RTFUNC_FAIL, "CVODE", "cvRcheck1",
                       MSGCV_RTFUNC_FAILED, cv_mem->cv_tn);
        SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
        return(CV_RTFUNC_FAIL);
      }

    }

  } /* end of first call block */

  /*
   * ------------------------------------------------------
   * 3. At following steps, perform stop tests:
   *    - check for root in last step
   *    - check if we passed tstop
   *    - check if we passed tout (NORMAL mode)
   *    - check if current tn was returned (ONE_STEP mode)
   *    - check if we are close to tstop
   *      (adjust step size if needed)
   * -------------------------------------------------------
   */

  if (cv_mem->cv_nst > 0) {

    /* Estimate an infinitesimal time interval to be used as
       a roundoff for time quantities (based on current time
       and step size) */
    troundoff = FUZZ_FACTOR * cv_mem->cv_uround *
      (SUNRabs(cv_mem->cv_tn) + SUNRabs(cv_mem->cv_h));

    /* First, check for a root in the last step taken, other than the
       last root found, if any.  If itask = CV_ONE_STEP and y(tn) was not
       returned because of an intervening root, return y(tn) now.     */
    if (cv_mem->cv_nrtfn > 0) {

      irfndp = cv_mem->cv_irfnd;

      retval = cvRcheck2(cv_mem);

      if (retval == CLOSERT) {
        cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "cvRcheck2",
                       MSGCV_CLOSE_ROOTS, cv_mem->cv_tlo);
        SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
        return(CV_ILL_INPUT);
      } else if (retval == CV_RTFUNC_FAIL) {
        cvProcessError(cv_mem, CV_RTFUNC_FAIL, "CVODE", "cvRcheck2",
                       MSGCV_RTFUNC_FAILED, cv_mem->cv_tlo);
        SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
        return(CV_RTFUNC_FAIL);
      } else if (retval == RTFOUND) {
        cv_mem->cv_tretlast = *tret = cv_mem->cv_tlo;
        SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
        return(CV_ROOT_RETURN);
      }

      /* If tn is distinct from tretlast (within roundoff),
         check remaining interval for roots */
      if ( SUNRabs(cv_mem->cv_tn - cv_mem->cv_tretlast) > troundoff ) {

        retval = cvRcheck3(cv_mem);

        if (retval == CV_SUCCESS) {     /* no root found */
          cv_mem->cv_irfnd = 0;
          if ((irfndp == 1) && (itask == CV_ONE_STEP)) {
            cv_mem->cv_tretlast = *tret = cv_mem->cv_tn;
            N_VScale(ONE, cv_mem->cv_zn[0], yout);
            SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
            return(CV_SUCCESS);
          }
        } else if (retval == RTFOUND) {  /* a new root was found */
          cv_mem->cv_irfnd = 1;
          cv_mem->cv_tretlast = *tret = cv_mem->cv_tlo;
          SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
          return(CV_ROOT_RETURN);
        } else if (retval == CV_RTFUNC_FAIL) {  /* g failed */
          cvProcessError(cv_mem, CV_RTFUNC_FAIL, "CVODE", "cvRcheck3",
                         MSGCV_RTFUNC_FAILED, cv_mem->cv_tlo);
          SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
          return(CV_RTFUNC_FAIL);
        }

      }

    } /* end of root stop check */

    /* In CV_NORMAL mode, test if tout was reached */
    if ( (itask == CV_NORMAL) && ((cv_mem->cv_tn-tout)*cv_mem->cv_h >= ZERO) ) {
      cv_mem->cv_tretlast = *tret = tout;
      ier =  CVodeGetDky(cv_mem, tout, 0, yout);
      if (ier != CV_SUCCESS) {
        cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVode",
                       MSGCV_BAD_TOUT, tout);
        SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
        return(CV_ILL_INPUT);
      }
      SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
      return(CV_SUCCESS);
    }

    /* In CV_ONE_STEP mode, test if tn was returned */
    if ( itask == CV_ONE_STEP &&
         SUNRabs(cv_mem->cv_tn - cv_mem->cv_tretlast) > troundoff ) {
      cv_mem->cv_tretlast = *tret = cv_mem->cv_tn;
      N_VScale(ONE, cv_mem->cv_zn[0], yout);
      SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
      return(CV_SUCCESS);
    }

    /* Test for tn at tstop or near tstop */
    if ( cv_mem->cv_tstopset ) {

      if ( SUNRabs(cv_mem->cv_tn - cv_mem->cv_tstop) <= troundoff ) {
        ier =  CVodeGetDky(cv_mem, cv_mem->cv_tstop, 0, yout);
        if (ier != CV_SUCCESS) {
          cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVode",
                         MSGCV_BAD_TSTOP, cv_mem->cv_tstop, cv_mem->cv_tn);
          SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
          return(CV_ILL_INPUT);
        }
        cv_mem->cv_tretlast = *tret = cv_mem->cv_tstop;
        cv_mem->cv_tstopset = SUNFALSE;
        SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
        return(CV_TSTOP_RETURN);
      }

      /* If next step would overtake tstop, adjust stepsize */
      if ( (cv_mem->cv_tn + cv_mem->cv_hprime - cv_mem->cv_tstop)*cv_mem->cv_h > ZERO ) {
        cv_mem->cv_hprime = (cv_mem->cv_tstop - cv_mem->cv_tn)*(ONE-FOUR*cv_mem->cv_uround);
        cv_mem->cv_eta = cv_mem->cv_hprime / cv_mem->cv_h;
      }

    }

  } /* end stopping tests block */

  /*
   * --------------------------------------------------
   * 4. Looping point for internal steps
   *
   *    4.1. check for errors (too many steps, too much
   *         accuracy requested, step size too small)
   *    4.2. take a new step (call cvStep)
   *    4.3. stop on error
   *    4.4. perform stop tests:
   *         - check for root in last step
   *         - check if tout was passed
   *         - check if close to tstop
   *         - check if in ONE_STEP mode (must return)
   * --------------------------------------------------
   */

  nstloc = 0;
  for(;;) {

    cv_mem->cv_next_h = cv_mem->cv_h;
    cv_mem->cv_next_q = cv_mem->cv_q;

    /* Reset and check ewt */
    if (cv_mem->cv_nst > 0) {

      ewtsetOK = cv_mem->cv_efun(cv_mem->cv_zn[0], cv_mem->cv_ewt, cv_mem->cv_e_data);

      if (ewtsetOK != 0) {

        if (cv_mem->cv_itol == CV_WF)
          cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVode",
                         MSGCV_EWT_NOW_FAIL, cv_mem->cv_tn);
        else
          cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVode",
                         MSGCV_EWT_NOW_BAD, cv_mem->cv_tn);

        istate = CV_ILL_INPUT;
        cv_mem->cv_tretlast = *tret = cv_mem->cv_tn;
        N_VScale(ONE, cv_mem->cv_zn[0], yout);
        break;
      }
    }

    /* Check for too many steps */
    if ( (cv_mem->cv_mxstep>0) && (nstloc >= cv_mem->cv_mxstep) ) {
      cvProcessError(cv_mem, CV_TOO_MUCH_WORK, "CVODE", "CVode",
                     MSGCV_MAX_STEPS, cv_mem->cv_tn);
      istate = CV_TOO_MUCH_WORK;
      cv_mem->cv_tretlast = *tret = cv_mem->cv_tn;
      N_VScale(ONE, cv_mem->cv_zn[0], yout);
      break;
    }

    /* Check for too much accuracy requested */
    nrm = N_VWrmsNorm(cv_mem->cv_zn[0], cv_mem->cv_ewt);
    cv_mem->cv_tolsf = cv_mem->cv_uround * nrm;
    if (cv_mem->cv_tolsf > ONE) {
      cvProcessError(cv_mem, CV_TOO_MUCH_ACC, "CVODE", "CVode",
                     MSGCV_TOO_MUCH_ACC, cv_mem->cv_tn);
      istate = CV_TOO_MUCH_ACC;
      cv_mem->cv_tretlast = *tret = cv_mem->cv_tn;
      N_VScale(ONE, cv_mem->cv_zn[0], yout);
      cv_mem->cv_tolsf *= TWO;
      break;
    } else {
      cv_mem->cv_tolsf = ONE;
    }

    /* Check for h below roundoff level in tn */
    if (cv_mem->cv_tn + cv_mem->cv_h == cv_mem->cv_tn) {
      cv_mem->cv_nhnil++;
      if (cv_mem->cv_nhnil <= cv_mem->cv_mxhnil)
        cvProcessError(cv_mem, CV_WARNING, "CVODE", "CVode", MSGCV_HNIL,
                       cv_mem->cv_tn, cv_mem->cv_h);
      if (cv_mem->cv_nhnil == cv_mem->cv_mxhnil)
        cvProcessError(cv_mem, CV_WARNING, "CVODE", "CVode", MSGCV_HNIL_DONE);
    }

    /* Call cvStep to take a step */
    kflag = cvStep(cv_mem);

    /* Process failed step cases, and exit loop */
    if (kflag != CV_SUCCESS) {
      istate = cvHandleFailure(cv_mem, kflag);
      cv_mem->cv_tretlast = *tret = cv_mem->cv_tn;
      N_VScale(ONE, cv_mem->cv_zn[0], yout);
      break;
    }

    nstloc++;

    /* If tstop is set and was reached, reset tn = tstop */
    if ( cv_mem->cv_tstopset ) {
      troundoff = FUZZ_FACTOR * cv_mem->cv_uround *
        (SUNRabs(cv_mem->cv_tn) + SUNRabs(cv_mem->cv_h));
      if ( SUNRabs(cv_mem->cv_tn - cv_mem->cv_tstop) <= troundoff)
        cv_mem->cv_tn = cv_mem->cv_tstop;
    }

    /* Check for root in last step taken. */
    if (cv_mem->cv_nrtfn > 0) {

      retval = cvRcheck3(cv_mem);

      if (retval == RTFOUND) {  /* A new root was found */
        cv_mem->cv_irfnd = 1;
        istate = CV_ROOT_RETURN;
        cv_mem->cv_tretlast = *tret = cv_mem->cv_tlo;
        break;
      } else if (retval == CV_RTFUNC_FAIL) { /* g failed */
        cvProcessError(cv_mem, CV_RTFUNC_FAIL, "CVODE", "cvRcheck3",
                       MSGCV_RTFUNC_FAILED, cv_mem->cv_tlo);
        istate = CV_RTFUNC_FAIL;
        break;
      }

      /* If we are at the end of the first step and we still have
       * some event functions that are inactive, issue a warning
       * as this may indicate a user error in the implementation
       * of the root function. */

      if (cv_mem->cv_nst==1) {
        inactive_roots = SUNFALSE;
        for (ir=0; ir<cv_mem->cv_nrtfn; ir++) {
          if (!cv_mem->cv_gactive[ir]) {
            inactive_roots = SUNTRUE;
            break;
          }
        }
        if ((cv_mem->cv_mxgnull > 0) && inactive_roots) {
          cvProcessError(cv_mem, CV_WARNING, "CVODE", "CVode",
                         MSGCV_INACTIVE_ROOTS);
        }
      }

    }

    /* In NORMAL mode, check if tout reached */
    if ( (itask == CV_NORMAL) &&  (cv_mem->cv_tn-tout)*cv_mem->cv_h >= ZERO ) {
      istate = CV_SUCCESS;
      cv_mem->cv_tretlast = *tret = tout;
      (void) CVodeGetDky(cv_mem, tout, 0, yout);
      cv_mem->cv_next_q = cv_mem->cv_qprime;
      cv_mem->cv_next_h = cv_mem->cv_hprime;
      break;
    }

    /* Check if tn is at tstop or near tstop */
    if ( cv_mem->cv_tstopset ) {

      troundoff = FUZZ_FACTOR * cv_mem->cv_uround *
        (SUNRabs(cv_mem->cv_tn) + SUNRabs(cv_mem->cv_h));
      if ( SUNRabs(cv_mem->cv_tn - cv_mem->cv_tstop) <= troundoff) {
        (void) CVodeGetDky(cv_mem, cv_mem->cv_tstop, 0, yout);
        cv_mem->cv_tretlast = *tret = cv_mem->cv_tstop;
        cv_mem->cv_tstopset = SUNFALSE;
        istate = CV_TSTOP_RETURN;
        break;
      }

      if ( (cv_mem->cv_tn + cv_mem->cv_hprime - cv_mem->cv_tstop)*cv_mem->cv_h > ZERO ) {
        cv_mem->cv_hprime = (cv_mem->cv_tstop - cv_mem->cv_tn)*(ONE-FOUR*cv_mem->cv_uround);
        cv_mem->cv_eta = cv_mem->cv_hprime / cv_mem->cv_h;
      }

    }

    /* In ONE_STEP mode, copy y and exit loop */
    if (itask == CV_ONE_STEP) {
      istate = CV_SUCCESS;
      cv_mem->cv_tretlast = *tret = cv_mem->cv_tn;
      N_VScale(ONE, cv_mem->cv_zn[0], yout);
      cv_mem->cv_next_q = cv_mem->cv_qprime;
      cv_mem->cv_next_h = cv_mem->cv_hprime;
      break;
    }

  } /* end looping for internal steps */


  SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
  return(istate);
}